

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HopcroftKarpAlgorithm.cpp
# Opt level: O2

bool __thiscall BoxNesting::HopcroftKarpAlgorithm::bfs(HopcroftKarpAlgorithm *this)

{
  short sVar1;
  short sVar2;
  short sVar3;
  pointer psVar4;
  pointer pvVar5;
  short *psVar6;
  pointer psVar7;
  short *psVar8;
  queue<short,_std::deque<short,_std::allocator<short>_>_> queue;
  short local_7a;
  _Deque_base<short,_std::allocator<short>_> local_78;
  
  std::queue<short,std::deque<short,std::allocator<short>>>::
  queue<std::deque<short,std::allocator<short>>,void>
            ((queue<short,_std::deque<short,_std::allocator<short>_>_> *)&local_78);
  for (local_7a = 1; local_7a <= this->leftVerticesCount; local_7a = local_7a + 1) {
    psVar4 = (this->distances).super__Vector_base<short,_std::allocator<short>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->pairsLeft).super__Vector_base<short,_std::allocator<short>_>._M_impl.
        super__Vector_impl_data._M_start[local_7a] == 0) {
      psVar4[local_7a] = 0;
      std::deque<short,_std::allocator<short>_>::push_back
                ((deque<short,_std::allocator<short>_> *)&local_78,&local_7a);
    }
    else {
      psVar4[local_7a] = 0x7fff;
    }
  }
  *(this->distances).super__Vector_base<short,_std::allocator<short>_>._M_impl.
   super__Vector_impl_data._M_start = 0x7fff;
  while (local_78._M_impl.super__Deque_impl_data._M_finish._M_cur !=
         local_78._M_impl.super__Deque_impl_data._M_start._M_cur) {
    sVar1 = *local_78._M_impl.super__Deque_impl_data._M_start._M_cur;
    std::deque<short,_std::allocator<short>_>::pop_front
              ((deque<short,_std::allocator<short>_> *)&local_78);
    psVar8 = (this->distances).super__Vector_base<short,_std::allocator<short>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (psVar8[sVar1] < *psVar8) {
      pvVar5 = (this->graph).
               super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar6 = *(pointer *)
                ((long)&pvVar5[sVar1].super__Vector_base<short,_std::allocator<short>_>._M_impl + 8)
      ;
      for (psVar8 = *(short **)
                     &pvVar5[sVar1].super__Vector_base<short,_std::allocator<short>_>._M_impl;
          psVar8 != psVar6; psVar8 = psVar8 + 1) {
        sVar2 = *psVar8;
        psVar4 = (this->pairsRight).super__Vector_base<short,_std::allocator<short>_>._M_impl.
                 super__Vector_impl_data._M_start;
        psVar7 = (this->distances).super__Vector_base<short,_std::allocator<short>_>._M_impl.
                 super__Vector_impl_data._M_start;
        sVar3 = psVar4[sVar2];
        if (psVar7[sVar3] == 0x7fff) {
          psVar7[sVar3] = psVar7[sVar1] + 1;
          std::deque<short,_std::allocator<short>_>::push_back
                    ((deque<short,_std::allocator<short>_> *)&local_78,psVar4 + sVar2);
        }
      }
    }
  }
  sVar1 = *(this->distances).super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::_Deque_base<short,_std::allocator<short>_>::~_Deque_base(&local_78);
  return sVar1 != 0x7fff;
}

Assistant:

bool HopcroftKarpAlgorithm::bfs() const
{
	std::queue<int16_t> queue;

	// Iterate through first layer of the graph from the left
	// partition of the bipartite graph. If there is a vertex
	// that doesn't have a pair we add it to the queue
	// since we can use that vertex to traverse.
	// If it allready has a pair we set the distance to
	// to infinite because we can traverse it later from
	// left part of the graph
	for (int16_t i = 1; i <= this->leftVerticesCount; ++i) 
	{ 
		if (this->pairsLeft[i] == NILL) 
		{ 
			this->distances[i] = 0; 
			queue.push(i); 
		} 
		else
		{
			this->distances[i] = INF;
		}
	}

	// If find a shortest augmented path we end at NILL and thus
	// the distance would become the length of the path
	// We use this information to eleminate path that are not the shortest
	// since we can allready see that any path that is longer then this
	// distance is not the shortest path.
	this->distances[NILL] = INF;

	// Continue traversing through the layers
	// While nodes in the partition are unmatched
	// or have a previous match. If that is not the case
	// the next vertex is NILL and we are getting there first
	// time this run
	while (!queue.empty()) 
	{ 
		auto i = queue.front(); 
		queue.pop(); 

		if (this->distances[i] < this->distances[NILL]) 
		{ 
			for (auto j : this->graph[i])
			{
				if (this->distances[this->pairsRight[j]] == INF) 
				{ 
					this->distances[this->pairsRight[j]] = this->distances[i] + 1; 
					queue.push(this->pairsRight[j]); 
				} 
			} 
		} 
	} 

	// If we could come back to NIL using alternating path of distinct 
	// vertices that is shorter then before then distance to null must
	// be set
	return this->distances[NILL] != INF; 
}